

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

ssize_t __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,int __fd,void *__buf,size_t __n)

{
  size_t *psVar1;
  basic_substring<const_char> *this_00;
  code *pcVar2;
  Location loc;
  Location loc_00;
  Location LVar3;
  Location LVar4;
  bool bVar5;
  error_flags eVar6;
  int iVar7;
  ssize_t sVar8;
  ssize_t extraout_RAX;
  undefined4 extraout_var;
  undefined8 uVar9;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t extraout_RAX_02;
  ssize_t extraout_RAX_03;
  size_t sVar10;
  ssize_t extraout_RAX_04;
  size_t sVar11;
  undefined4 in_register_00000034;
  csubstr *pcVar12;
  char *pcVar13;
  bool explicit_key;
  uint uVar14;
  csubstr s;
  csubstr s_00;
  basic_substring<const_char> bVar15;
  char msg [133];
  basic_substring<const_char> local_b8;
  undefined8 local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  
  pcVar12 = (csubstr *)CONCAT44(in_register_00000034,__fd);
  if (pcVar12->str != (char *)0x0 && pcVar12->len != 0) {
    _write_tag(this,*pcVar12);
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
  }
  uVar14 = (uint)__buf;
  if (((ulong)__buf & 0x300) == 0) {
    if (((ulong)__buf & 0xc0) != 0) {
      iVar7 = basic_substring<const_char>::compare(pcVar12 + 2,"<<",2);
      uVar9 = CONCAT44(extraout_var,iVar7);
      if (iVar7 != 0) {
        uVar9 = std::ostream::put((char)(this->
                                        super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ).m_stream + '\x10');
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
      }
      sVar10 = pcVar12[2].len;
      if (pcVar12[2].str == (char *)0x0 || sVar10 == 0) {
        return CONCAT71((int7)((ulong)uVar9 >> 8),sVar10 == 0);
      }
      sVar8 = std::ostream::write((char *)((this->
                                           super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           ).m_stream + 0x10),(long)pcVar12[2].str);
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + sVar10;
      return sVar8;
    }
  }
  else {
    if (((ulong)__buf & 0xc0) != 0) {
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        sVar8 = (*pcVar2)();
        return sVar8;
      }
      local_b8.str = (char *)0x0;
      local_b8.len = 0x5a05;
      local_a8 = 0;
      pcStack_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_98 = 0x65;
      loc.super_LineCol.col = 0;
      loc.super_LineCol.offset = SUB168(ZEXT816(0x5a05) << 0x40,0);
      loc.super_LineCol.line = SUB168(ZEXT816(0x5a05) << 0x40,8);
      loc.name.str = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc.name.len = 0x65;
      yml::error("check failed: flags.is_ref() != flags.has_anchor()",0x32,loc);
    }
    if ((pcVar12[2].len == 0) || (pcVar12[2].str == (char *)0x0)) {
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        sVar8 = (*pcVar2)();
        return sVar8;
      }
      local_b8.str = (char *)0x0;
      local_b8.len = 0x5a06;
      local_a8 = 0;
      pcStack_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_98 = 0x65;
      loc_00.super_LineCol.col = 0;
      loc_00.super_LineCol.offset = SUB168(ZEXT816(0x5a06) << 0x40,0);
      loc_00.super_LineCol.line = SUB168(ZEXT816(0x5a06) << 0x40,8);
      loc_00.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_00.name.len = 0x65;
      yml::error("check failed: ! sc.anchor.empty()",0x21,loc_00);
    }
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
    sVar10 = pcVar12[2].len;
    if (pcVar12[2].str != (char *)0x0 && sVar10 != 0) {
      std::ostream::write((char *)((this->
                                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ).m_stream + 0x10),(long)pcVar12[2].str);
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + sVar10;
    }
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
  }
  if ((((ulong)__buf & 0x7fe0000) != 0) &&
     ((((ulong)__buf & 0x2aa0000) == 0) != (((ulong)__buf & 0x5540000) != 0))) {
    memcpy(&local_b8,
           "check failed: (((flags & (_WIP_KEY_STYLE|_WIP_VAL_STYLE)) == 0) || (((flags&_WIP_KEY_STYLE) == 0) != ((flags&_WIP_VAL_STYLE) == 0)))"
           ,0x85);
    eVar6 = get_error_flags();
    if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      sVar8 = (*pcVar2)();
      return sVar8;
    }
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x5a14) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x5a14) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_tree->m_callbacks).m_error)
              ((char *)&local_b8,0x85,LVar3,(this->m_tree->m_callbacks).m_user_data);
  }
  if (((ulong)__buf & 0x60000) == 0) {
    if (((ulong)__buf & 0x180000) != 0) {
      _write_scalar_folded(this,pcVar12[1],__n,SUB41((uVar14 & 2) >> 1,0));
      return extraout_RAX_00;
    }
    if (((ulong)__buf & 0x600000) != 0) {
      _write_scalar_squo(this,pcVar12[1],__n);
      return extraout_RAX_01;
    }
    if (((ulong)__buf & 0x1800000) != 0) {
      _write_scalar_dquo(this,pcVar12[1],__n);
      return extraout_RAX_02;
    }
    if (((ulong)__buf & 0x6000000) != 0) {
      _write_scalar_plain(this,pcVar12[1],__n);
      return extraout_RAX_03;
    }
    if (((ulong)__buf & 0x7fe0000) != 0) {
      local_b8.str = (char *)0x6c706d6920746f6e;
      local_b8.len._0_1_ = 'e';
      local_b8.len._1_1_ = 'm';
      local_b8.len._2_1_ = 'e';
      local_b8.len._3_1_ = 'n';
      local_b8.len._4_1_ = 't';
      local_b8.len._5_1_ = 'e';
      local_b8.len._6_1_ = 'd';
      local_b8.len._7_1_ = '\0';
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        sVar8 = (*pcVar2)();
        return sVar8;
      }
      LVar4.super_LineCol.col = 0;
      LVar4.super_LineCol.offset = SUB168(ZEXT816(0x5a47) << 0x40,0);
      LVar4.super_LineCol.line = SUB168(ZEXT816(0x5a47) << 0x40,8);
      LVar4.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar4.name.len = 0x65;
      sVar8 = (*(this->m_tree->m_callbacks).m_error)
                        ((char *)&local_b8,0x10,LVar4,(this->m_tree->m_callbacks).m_user_data);
      return sVar8;
    }
    this_00 = pcVar12 + 1;
    bVar5 = false;
    sVar10 = basic_substring<const_char>::first_not_of(this_00,'\n',0);
    if (sVar10 != 0xffffffffffffffff) {
      if (pcVar12[1].len < sVar10) {
        eVar6 = get_error_flags();
        if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          pcVar2 = (code *)swi(3);
          sVar8 = (*pcVar2)();
          return sVar8;
        }
        handle_error(0x1f9037,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                (&local_b8,this_00->str + sVar10,pcVar12[1].len - sVar10);
      if (local_b8.len == 0) {
        bVar5 = false;
      }
      else {
        bVar5 = *local_b8.str == '\t' || *local_b8.str == ' ';
      }
    }
    pcVar13 = pcVar12[1].str;
    sVar11 = pcVar12[1].len;
    if (((pcVar13 != (char *)0x0 && sVar11 != 0) && sVar10 == 0xffffffffffffffff) ||
       (bVar5 == false)) {
      if ((pcVar13 == (char *)0x0 || sVar11 == 0) || sVar10 != 0xffffffffffffffff)
      goto LAB_0018ec92;
    }
    else {
      bVar15 = basic_substring<const_char>::trim(this_00,' ');
      if (bVar15.str == (char *)0x0 || bVar15.len == 0) {
        pcVar13 = pcVar12[1].str;
        sVar11 = pcVar12[1].len;
LAB_0018ec92:
        if (sVar11 != 0) {
          sVar10 = 0;
          do {
            if (pcVar13[sVar10] == '\n') goto LAB_0018ec6f;
            sVar10 = sVar10 + 1;
          } while (sVar11 != sVar10);
        }
        s_00.len = sVar11;
        s_00.str = pcVar13;
        _write_scalar(this,s_00,(~uVar14 & 0x1001) == 0 || (~uVar14 & 0x2002) == 0);
        return extraout_RAX_04;
      }
      pcVar13 = pcVar12[1].str;
      sVar11 = pcVar12[1].len;
    }
LAB_0018ec6f:
    explicit_key = SUB41((uVar14 & 2) >> 1,0);
  }
  else {
    pcVar13 = pcVar12[1].str;
    sVar11 = pcVar12[1].len;
    explicit_key = SUB41((uVar14 & 2) >> 1,0);
    bVar5 = false;
  }
  s.len = sVar11;
  s.str = pcVar13;
  _write_scalar_literal(this,s,__n,explicit_key,bVar5);
  return extraout_RAX;
}

Assistant:

void Emitter<Writer>::_write(NodeScalar const& C4_RESTRICT sc, NodeType flags, size_t ilevel)
{
    if( ! sc.tag.empty())
    {
        _write_tag(sc.tag);
        this->Writer::_do_write(' ');
    }
    if(flags.has_anchor())
    {
        RYML_ASSERT(flags.is_ref() != flags.has_anchor());
        RYML_ASSERT( ! sc.anchor.empty());
        this->Writer::_do_write('&');
        this->Writer::_do_write(sc.anchor);
        this->Writer::_do_write(' ');
    }
    else if(flags.is_ref())
    {
        if(sc.anchor != "<<")
            this->Writer::_do_write('*');
        this->Writer::_do_write(sc.anchor);
        return;
    }

    // ensure the style flags only have one of KEY or VAL
    _RYML_CB_ASSERT(m_tree->callbacks(), ((flags & (_WIP_KEY_STYLE|_WIP_VAL_STYLE)) == 0) || (((flags&_WIP_KEY_STYLE) == 0) != ((flags&_WIP_VAL_STYLE) == 0)));

    auto style_marks = flags & (_WIP_KEY_STYLE|_WIP_VAL_STYLE);
    if(style_marks & (_WIP_KEY_LITERAL|_WIP_VAL_LITERAL))
    {
        _write_scalar_literal(sc.scalar, ilevel, flags.has_key());
    }
    else if(style_marks & (_WIP_KEY_FOLDED|_WIP_VAL_FOLDED))
    {
        _write_scalar_folded(sc.scalar, ilevel, flags.has_key());
    }
    else if(style_marks & (_WIP_KEY_SQUO|_WIP_VAL_SQUO))
    {
        _write_scalar_squo(sc.scalar, ilevel);
    }
    else if(style_marks & (_WIP_KEY_DQUO|_WIP_VAL_DQUO))
    {
        _write_scalar_dquo(sc.scalar, ilevel);
    }
    else if(style_marks & (_WIP_KEY_PLAIN|_WIP_VAL_PLAIN))
    {
        _write_scalar_plain(sc.scalar, ilevel);
    }
    else if(!style_marks)
    {
        size_t first_non_nl = sc.scalar.first_not_of('\n');
        bool all_newlines = first_non_nl == npos;
        bool has_leading_ws = (!all_newlines) && sc.scalar.sub(first_non_nl).begins_with_any(" \t");
        bool do_literal = ((!sc.scalar.empty() && all_newlines) || (has_leading_ws && !sc.scalar.trim(' ').empty()));
        if(do_literal)
        {
            _write_scalar_literal(sc.scalar, ilevel, flags.has_key(), /*explicit_indentation*/has_leading_ws);
        }
        else
        {
            for(size_t i = 0; i < sc.scalar.len; ++i)
            {
                if(sc.scalar.str[i] == '\n')
                {
                    _write_scalar_literal(sc.scalar, ilevel, flags.has_key(), /*explicit_indentation*/has_leading_ws);
                    goto wrote_special;
                }
                // todo: check for escaped characters requiring double quotes
            }
            _write_scalar(sc.scalar, flags.is_quoted());
        wrote_special:
            ;
        }
    }
    else
    {
        _RYML_CB_ERR(m_tree->callbacks(), "not implemented");
    }
}